

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  Pair *pPVar1;
  ulong uVar2;
  Pair *it;
  ulong uVar3;
  ulong uVar4;
  Pair local_10;
  
  pPVar1 = (this->Data).Data;
  uVar3 = (ulong)(this->Data).Size;
  it = pPVar1;
  uVar4 = uVar3;
  while (uVar2 = uVar4, uVar2 != 0) {
    uVar4 = uVar2 >> 1;
    if (it[uVar4].key < key) {
      it = it + uVar4 + 1;
      uVar4 = ~uVar4 + uVar2;
    }
  }
  if ((it == pPVar1 + uVar3) || (it->key != key)) {
    local_10.key = key;
    local_10.field_1.val_f = val;
    ImVector<ImGuiStorage::Pair>::insert(&this->Data,it,&local_10);
  }
  else {
    (it->field_1).val_f = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_f = val;
}